

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<std::pair<QModelIndex,_int>_>::relocate
          (QArrayDataPointer<std::pair<QModelIndex,_int>_> *this,qsizetype offset,
          pair<QModelIndex,_int> **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<std::pair<QModelIndex,_int>_> *in_RDI;
  pair<QModelIndex,_int> **unaff_retaddr;
  pair<QModelIndex,_int> *res;
  pair<QModelIndex,_int> *first;
  QArrayDataPointer<std::pair<QModelIndex,_int>_> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<std::pair<QModelIndex,int>,long_long>
            (first,(longlong)in_RDI,(pair<QModelIndex,_int> *)0x90aa77);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<std::pair<QModelIndex,int>>,std::pair<QModelIndex,int>const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 0x20 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }